

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tan.c
# Opt level: O1

double tancot(double xx,int cotflg)

{
  uint uVar1;
  char *name;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = -xx;
  if (-xx <= xx) {
    dVar4 = xx;
  }
  if (1073741824.0 < dVar4) {
    if (cotflg == 0) {
      name = "tan";
    }
    else {
      name = "cot";
    }
    mtherr(name,5);
    return 0.0;
  }
  dVar2 = floor(dVar4 / PIO4);
  dVar3 = ldexp(dVar2,-3);
  dVar3 = floor(dVar3);
  dVar3 = ldexp(dVar3,3);
  dVar3 = dVar2 - dVar3;
  uVar1 = (int)dVar3 & 1;
  if (uVar1 != 0) {
    dVar2 = dVar2 + 1.0;
  }
  dVar2 = dVar2 * -3.061616997868383e-17 +
          dVar2 * -7.946627356147928e-09 + dVar4 + dVar2 * -0.7853981554508209;
  dVar4 = dVar2 * dVar2;
  if (1e-14 < dVar4) {
    dVar5 = polevl(dVar4,P,2);
    dVar6 = p1evl(dVar4,Q,4);
    dVar2 = dVar2 + ((dVar5 * dVar4) / dVar6) * dVar2;
  }
  if ((uVar1 + (int)dVar3 & 2) == 0) {
    if (cotflg == 0) goto LAB_0056f3e7;
    dVar4 = 1.0;
  }
  else {
    if (cotflg != 0) {
      dVar2 = -dVar2;
      goto LAB_0056f3e7;
    }
    dVar4 = -1.0;
  }
  dVar2 = dVar4 / dVar2;
LAB_0056f3e7:
  return (double)(~-(ulong)(xx < 0.0) & (ulong)dVar2 | (ulong)-dVar2 & -(ulong)(xx < 0.0));
}

Assistant:

static double tancot( xx, cotflg )
double xx;
int cotflg;
{
double x, y, z, zz;
int j, sign;

/* make argument positive but save the sign */
if( xx < 0 )
	{
	x = -xx;
	sign = -1;
	}
else
	{
	x = xx;
	sign = 1;
	}

if( x > lossth )
	{
	if( cotflg )
		mtherr( "cot", TLOSS );
	else
		mtherr( "tan", TLOSS );
	return(0.0);
	}

/* compute x mod PIO4 */
y = floor( x/PIO4 );

/* strip high bits of integer part */
z = ldexp( y, -3 );
z = floor(z);		/* integer part of y/8 */
z = y - ldexp( z, 3 );  /* y - 16 * (y/16) */

/* integer and fractional part modulo one octant */
j = (int)z;

/* map zeros and singularities to origin */
if( j & 1 )
	{
	j += 1;
	y += 1.0;
	}

z = ((x - y * DP1) - y * DP2) - y * DP3;

zz = z * z;

if( zz > 1.0e-14 )
	y = z  +  z * (zz * polevl( zz, P, 2 )/p1evl(zz, Q, 4));
else
	y = z;
	
if( j & 2 )
	{
	if( cotflg )
		y = -y;
	else
		y = -1.0/y;
	}
else
	{
	if( cotflg )
		y = 1.0/y;
	}

if( sign < 0 )
	y = -y;

return( y );
}